

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::iterate(ThreadCleanUpTest *this)

{
  ostringstream *this_00;
  EGLDisplay pvVar1;
  EGLConfig pvVar2;
  EGLSurface pvVar3;
  EGLContext pvVar4;
  Library *pLVar5;
  IterateResult IVar6;
  bool bVar7;
  Maybe<eglu::Error> error;
  Thread local_1f8;
  Library *local_1e0;
  EGLDisplay local_1d8;
  EGLSurface local_1d0;
  EGLContext pvStack_1c8;
  EGLConfig local_1c0;
  Maybe<eglu::Error> *local_1b8;
  MessageBuilder local_1b0;
  
  if (this->m_iterNdx < this->m_iterCount) {
    error.m_ptr = (Error *)0x0;
    pLVar5 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    pvVar1 = this->m_display;
    pvVar2 = this->m_config;
    pvVar3 = this->m_surface;
    pvVar4 = this->m_context;
    de::Thread::Thread(&local_1f8);
    local_1f8._vptr_Thread = (_func_int **)&PTR__Thread_003d8bd0;
    local_1e0 = pLVar5;
    local_1d8 = pvVar1;
    local_1d0 = pvVar3;
    pvStack_1c8 = pvVar4;
    local_1c0 = pvVar2;
    local_1b8 = &error;
    de::Thread::start(&local_1f8);
    de::Thread::join(&local_1f8);
    bVar7 = error.m_ptr == (Error *)0x0;
    if (bVar7) {
      this->m_iterNdx = this->m_iterNdx + 1;
    }
    else {
      local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"Failed. Got error: ");
      std::operator<<((ostream *)this_00,*(char **)&(error.m_ptr)->field_0x10);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 *(char **)&(error.m_ptr)->field_0x10);
    }
    IVar6 = (IterateResult)bVar7;
    de::Thread::~Thread(&local_1f8);
    if (error.m_ptr != (Error *)0x0) {
      (*(code *)**(undefined8 **)error.m_ptr)();
    }
  }
  else {
    IVar6 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return IVar6;
}

Assistant:

IterateResult iterate (void)
	{
		if (m_iterNdx < m_iterCount)
		{
			tcu::Maybe<eglu::Error> error;

			Thread thread (m_eglTestCtx.getLibrary(), m_display, m_surface, m_context, m_config, error);

			thread.start();
			thread.join();

			if (error)
			{
				m_testCtx.getLog() << TestLog::Message << "Failed. Got error: " << error->getMessage() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, error->getMessage());
				return STOP;
			}

			m_iterNdx++;
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}